

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::HandleLocationPropertyPolicy(cmTarget *this,cmMakefile *context)

{
  PolicyStatus PVar1;
  size_t sVar2;
  ostream *poVar3;
  PolicyID id;
  bool bVar4;
  char *__s;
  MessageType t;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  if (this->IsImportedTarget != false) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  PVar1 = cmMakefile::GetPolicyStatus(context,CMP0026);
  if (PVar1 - NEW < 3) {
    t = FATAL_ERROR;
    __s = "may";
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (PVar1 != WARN) goto LAB_0030f79a;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x1a,id);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    t = AUTHOR_WARNING;
    bVar4 = true;
    __s = "should";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"The LOCATION property ",0x16);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0," not be read from target \"",0x1a);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->Name)._M_dataplus._M_p,
                      (this->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             "\".  Use the target name directly with add_custom_command, or use the generator expression $<TARGET_FILE>, as appropriate.\n"
             ,0x7a);
  std::__cxx11::stringbuf::str();
  cmMakefile::IssueMessage(context,t,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
LAB_0030f79a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return bVar4;
}

Assistant:

bool cmTarget::HandleLocationPropertyPolicy(cmMakefile* context) const
{
  if (this->IsImported())
    {
    return true;
    }
  std::ostringstream e;
  const char *modal = 0;
  cmake::MessageType messageType = cmake::AUTHOR_WARNING;
  switch (context->GetPolicyStatus(cmPolicies::CMP0026))
    {
    case cmPolicies::WARN:
      e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0026) << "\n";
      modal = "should";
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      modal = "may";
      messageType = cmake::FATAL_ERROR;
    }

  if (modal)
    {
    e << "The LOCATION property " << modal << " not be read from target \""
      << this->GetName() << "\".  Use the target name directly with "
      "add_custom_command, or use the generator expression $<TARGET_FILE>, "
      "as appropriate.\n";
    context->IssueMessage(messageType, e.str());
    }

  return messageType != cmake::FATAL_ERROR;
}